

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_instance.cpp
# Opt level: O0

void __thiscall ON_InstanceDefinition::SetURL_Tag(ON_InstanceDefinition *this,wchar_t *url_tag)

{
  bool bVar1;
  ON_wString local_20;
  ON_wString s;
  wchar_t *url_tag_local;
  ON_InstanceDefinition *this_local;
  
  s.m_s = url_tag;
  ON_wString::ON_wString(&local_20,url_tag);
  ON_wString::TrimLeftAndRight(&local_20,(wchar_t *)0x0);
  bVar1 = ::operator==(&local_20,&this->m_url_tag);
  if (!bVar1) {
    bVar1 = ON_wString::IsEmpty(&local_20);
    if (bVar1) {
      ON_wString::operator=(&this->m_url_tag,&ON_wString::EmptyString);
    }
    else {
      ON_wString::operator=(&this->m_url_tag,&local_20);
    }
    Internal_ContentChanged(this);
  }
  ON_wString::~ON_wString(&local_20);
  return;
}

Assistant:

void ON_InstanceDefinition::SetURL_Tag( const wchar_t* url_tag )
{
  ON_wString s(url_tag);
  s.TrimLeftAndRight();
  if (s == m_url_tag)
    return;


  if (s.IsEmpty())
    m_url_tag = ON_wString::EmptyString;
  else
    m_url_tag = s;
  Internal_ContentChanged();
}